

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

QDate __thiscall
QtPrivate::QCalendarYearValidator::applyToDate
          (undefined8 param_1,undefined8 param_2,undefined8 param_3)

{
  QDate QVar1;
  long in_FS_OFFSET;
  undefined1 auVar2 [12];
  int iStack_34;
  undefined1 local_28 [16];
  
  local_28._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_8_ = param_3;
  auVar2 = QCalendar::partsFromDate((QDate)local_28);
  if (auVar2._0_8_ >> 0x20 == 0x80000000) {
    QVar1.jd = -0x8000000000000000;
  }
  else {
    iStack_34 = auVar2._4_4_;
    QCalendar::daysInMonth((int)(YearMonthDay *)local_28,iStack_34);
    QVar1.jd = QCalendar::dateFromParts((YearMonthDay *)local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28._8_8_) {
    return (QDate)QVar1.jd;
  }
  __stack_chk_fail();
}

Assistant:

QDate QCalendarYearValidator::applyToDate(QDate date, QCalendar cal) const
{
    auto parts = cal.partsFromDate(date);
    if (!parts.isValid())
        return QDate();
    // This widget does not support negative years (some calendars may support)
    parts.year = qMax(1, m_year);
    parts.day = qMin(parts.day, cal.daysInMonth(parts.month, parts.year));
    return cal.dateFromParts(parts);
}